

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11.c
# Opt level: O0

int platform_make_x11_server
              (Plug *plug,char *progname,int mindisp,char *screen_number_suffix,ptrlen authproto,
              ptrlen authdata,Socket **sockets,Conf *conf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  strbuf *buf_o;
  Socket *pSVar5;
  char *pcVar6;
  char *__s2;
  SockAddr *listenaddr;
  ssize_t sVar7;
  FILE *__s;
  char *display;
  int buf [1024];
  int local_ac;
  pid_t pid;
  int cleanup_pipe [2];
  int oldumask;
  char *canonicalname;
  char *hostname;
  int addrtype;
  int tcp_port;
  char *err;
  int nsockets;
  int displayno;
  FILE *authfp;
  int authfd;
  SockAddr *a_unix;
  SockAddr *a_tcp;
  char *unix_path;
  strbuf *authfiledata;
  char *authfilename;
  char *tmpdir;
  char *screen_number_suffix_local;
  int mindisp_local;
  char *progname_local;
  Plug *plug_local;
  ptrlen authproto_local;
  
  authfiledata = (strbuf *)0x0;
  a_tcp = (SockAddr *)0x0;
  a_unix = (SockAddr *)0x0;
  buf_o = strbuf_new_nm();
  err._0_4_ = 0;
  err._4_4_ = mindisp;
  while( true ) {
    pSVar5 = new_listener((char *)0x0,err._4_4_ + 6000,plug,false,conf,1);
    *sockets = pSVar5;
    pcVar6 = sk_socket_error(*sockets);
    if (pcVar6 == (char *)0x0) break;
    sk_close(*sockets);
    __s2 = strerror(0x62);
    iVar2 = strcmp(pcVar6,__s2);
    if (iVar2 != 0) goto LAB_0015ffaa;
    err._4_4_ = err._4_4_ + 1;
  }
  pcVar6 = get_hostname();
  if (pcVar6 != (char *)0x0) {
    stack0xffffffffffffff60 = (void *)0x0;
    a_unix = sk_namelookup(pcVar6,(char **)(cleanup_pipe + 1),1);
    safefree(stack0xffffffffffffff60);
  }
  safefree(pcVar6);
  err._0_4_ = 1;
  if (a_unix != (SockAddr *)0x0) {
    x11_format_auth_for_authfile(buf_o->binarysink_,a_unix,err._4_4_,authproto,authdata);
  }
  a_tcp = (SockAddr *)dupprintf("/tmp/.X11-unix/X%d",(ulong)err._4_4_);
  listenaddr = unix_sock_addr((char *)a_tcp);
  pSVar5 = new_unix_listener(listenaddr,plug);
  sockets[1] = pSVar5;
  pcVar6 = sk_socket_error(sockets[1]);
  if (pcVar6 == (char *)0x0) {
    x11_format_auth_for_authfile(buf_o->binarysink_,listenaddr,err._4_4_,authproto,authdata);
    err._0_4_ = 2;
  }
  else {
    sk_close(sockets[1]);
    safefree(a_tcp);
    a_tcp = (SockAddr *)0x0;
  }
  authfilename = getenv("TMPDIR");
  if ((authfilename == (char *)0x0) || (*authfilename == '\0')) {
    authfilename = "/tmp";
  }
  authfiledata = (strbuf *)dupcat_fn(authfilename,"/",progname,"-Xauthority-XXXXXX",0);
  cleanup_pipe[0] = umask(0x3f);
  iVar2 = mkstemp((char *)authfiledata);
  umask(cleanup_pipe[0]);
  if (iVar2 < 0) {
    while (iVar2 = (int)err + -1, bVar1 = 0 < (int)err, err._0_4_ = iVar2, bVar1) {
      sk_close(sockets[iVar2]);
    }
  }
  else {
    iVar3 = pipe(&local_ac);
    if (iVar3 == 0) {
      _Var4 = fork();
      if (_Var4 == 0) {
        close(0);
        close(1);
        close(2);
        setpgid(0,0);
        close(pid);
        close(iVar2);
        do {
          sVar7 = read(local_ac,&display,0x1000);
        } while (0 < sVar7);
        unlink((char *)authfiledata);
        if (a_tcp != (SockAddr *)0x0) {
          unlink((char *)a_tcp);
        }
        _exit(0);
      }
      if (_Var4 < 0) {
        close(local_ac);
        close(pid);
      }
      else {
        close(local_ac);
        cloexec(pid);
      }
    }
    __s = fdopen(iVar2,"wb");
    fwrite(buf_o->u,1,buf_o->len,__s);
    fclose(__s);
    pcVar6 = dupprintf(":%d%s",(ulong)err._4_4_,screen_number_suffix);
    conf_set_str_str(conf,0x38,"DISPLAY",pcVar6);
    safefree(pcVar6);
    conf_set_str_str(conf,0x38,"XAUTHORITY",(char *)authfiledata);
  }
LAB_0015ffaa:
  if (a_unix != (SockAddr *)0x0) {
    sk_addr_free(a_unix);
  }
  safefree(authfiledata);
  strbuf_free(buf_o);
  safefree(a_tcp);
  return (int)err;
}

Assistant:

int platform_make_x11_server(Plug *plug, const char *progname, int mindisp,
                             const char *screen_number_suffix,
                             ptrlen authproto, ptrlen authdata,
                             Socket **sockets, Conf *conf)
{
    char *tmpdir;
    char *authfilename = NULL;
    strbuf *authfiledata = NULL;
    char *unix_path = NULL;

    SockAddr *a_tcp = NULL, *a_unix = NULL;

    int authfd;
    FILE *authfp;

    int displayno;

    authfiledata = strbuf_new_nm();

    int nsockets = 0;

    /*
     * Look for a free TCP port to run our server on.
     */
    for (displayno = mindisp;; displayno++) {
        const char *err;
        int tcp_port = displayno + 6000;
        int addrtype = ADDRTYPE_IPV4;

        sockets[nsockets] = new_listener(
            NULL, tcp_port, plug, false, conf, addrtype);

        err = sk_socket_error(sockets[nsockets]);
        if (!err) {
            char *hostname = get_hostname();
            if (hostname) {
                char *canonicalname = NULL;
                a_tcp = sk_namelookup(hostname, &canonicalname, addrtype);
                sfree(canonicalname);
            }
            sfree(hostname);
            nsockets++;
            break;                     /* success! */
        } else {
            sk_close(sockets[nsockets]);
        }

        /*
         * If we weren't able to bind to this port because it's in use
         * by another program, go round this loop and try again. But
         * for any other reason, give up completely and return failure
         * to our caller.
         *
         * sk_socket_error currently has no machine-readable component
         * (it would need a cross-platform abstraction of the socket
         * error types we care about, plus translation from each OS
         * error enumeration into that). So we use the disgusting
         * approach of a string compare between the error string and
         * the one EADDRINUSE would have given :-(
         */
        if (strcmp(err, strerror(EADDRINUSE)))
            goto out;
    }

    if (a_tcp) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_tcp, displayno, authproto, authdata);
    }

    /*
     * Try to establish the Unix-domain analogue. That may or may not
     * work - file permissions in /tmp may prevent it, for example -
     * but it's worth a try, and we don't consider it a fatal error if
     * it doesn't work.
     */
    unix_path = dupprintf("/tmp/.X11-unix/X%d", displayno);
    a_unix = unix_sock_addr(unix_path);

    sockets[nsockets] = new_unix_listener(a_unix, plug);
    if (!sk_socket_error(sockets[nsockets])) {
        x11_format_auth_for_authfile(
            BinarySink_UPCAST(authfiledata),
            a_unix, displayno, authproto, authdata);
        nsockets++;
    } else {
        sk_close(sockets[nsockets]);
        sfree(unix_path);
        unix_path = NULL;
    }

    /*
     * Decide where the authority data will be written.
     */

    tmpdir = getenv("TMPDIR");
    if (!tmpdir || !*tmpdir)
        tmpdir = "/tmp";

    authfilename = dupcat(tmpdir, "/", progname, "-Xauthority-XXXXXX");

    {
        int oldumask = umask(077);
        authfd = mkstemp(authfilename);
        umask(oldumask);
    }
    if (authfd < 0) {
        while (nsockets-- > 0)
            sk_close(sockets[nsockets]);
        goto out;
    }

    /*
     * Spawn a subprocess which will try to reliably delete our
     * auth file when we terminate, in case we die unexpectedly.
     */
    {
        int cleanup_pipe[2];
        pid_t pid;

        /* Don't worry if pipe or fork fails; it's not _that_ critical. */
        if (!pipe(cleanup_pipe)) {
            if ((pid = fork()) == 0) {
                int buf[1024];
                /*
                 * Our parent process holds the writing end of
                 * this pipe, and writes nothing to it. Hence,
                 * we expect read() to return EOF as soon as
                 * that process terminates.
                 */

                close(0);
                close(1);
                close(2);

                setpgid(0, 0);
                close(cleanup_pipe[1]);
                close(authfd);
                while (read(cleanup_pipe[0], buf, sizeof(buf)) > 0);
                unlink(authfilename);
                if (unix_path)
                    unlink(unix_path);
                _exit(0);
            } else if (pid < 0) {
                close(cleanup_pipe[0]);
                close(cleanup_pipe[1]);
            } else {
                close(cleanup_pipe[0]);
                cloexec(cleanup_pipe[1]);
            }
        }
    }

    authfp = fdopen(authfd, "wb");
    fwrite(authfiledata->u, 1, authfiledata->len, authfp);
    fclose(authfp);

    {
        char *display = dupprintf(":%d%s", displayno, screen_number_suffix);
        conf_set_str_str(conf, CONF_environmt, "DISPLAY", display);
        sfree(display);
    }
    conf_set_str_str(conf, CONF_environmt, "XAUTHORITY", authfilename);

    /*
     * FIXME: return at least the DISPLAY and XAUTHORITY env settings,
     * and perhaps also the display number
     */

  out:
    if (a_tcp)
        sk_addr_free(a_tcp);
    /* a_unix doesn't need freeing, because new_unix_listener took it over */
    sfree(authfilename);
    strbuf_free(authfiledata);
    sfree(unix_path);
    return nsockets;
}